

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O3

JavascriptGeneratorFunction *
Js::JavascriptGeneratorFunction::OP_NewScGenFunc
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  bool bVar1;
  FunctionProxy *this;
  ThreadContext *pTVar2;
  JavascriptLibrary *this_00;
  code *pcVar3;
  bool bVar4;
  ScriptContext *scriptContext;
  GeneratorVirtualScriptFunction *scriptFunction;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  JavascriptGeneratorFunction *pJVar7;
  JavascriptMethod entryPoint;
  Type *addr;
  
  this = (infoRef->ptr->functionBodyImpl).ptr;
  scriptContext = FunctionProxy::GetScriptContext(this);
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  scriptFunction =
       JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                 ((scriptContext->super_ScriptContextBase).javascriptLibrary,this);
  ScriptFunction::SetEnvironment(&scriptFunction->super_ScriptFunction,environment);
  pFVar6 = (this->functionInfo).ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4ea,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_00bce415;
    *puVar5 = 0;
    pFVar6 = (this->functionInfo).ptr;
  }
  if ((pFVar6->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4eb,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) goto LAB_00bce415;
    *puVar5 = 0;
    pFVar6 = (this->functionInfo).ptr;
  }
  if ((pFVar6->attributes & Async) != None) {
    if ((pFVar6->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x57e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar4) goto LAB_00bce415;
      *puVar5 = 0;
      pFVar6 = (this->functionInfo).ptr;
    }
    if ((pFVar6->attributes & Module) == None) {
      if ((pFVar6->functionBodyImpl).ptr != this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x500,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar4) {
LAB_00bce415:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
        pFVar6 = (this->functionInfo).ptr;
      }
      if ((pFVar6->attributes & Generator) == None) {
        pJVar7 = &JavascriptAsyncFunction::New(scriptContext,scriptFunction)->
                  super_JavascriptGeneratorFunction;
      }
      else {
        pJVar7 = &JavascriptAsyncGeneratorFunction::New(scriptContext,scriptFunction)->
                  super_JavascriptGeneratorFunction;
      }
      goto LAB_00bce3d2;
    }
  }
  this_00 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  entryPoint = FunctionInfo::GetOriginalEntryPoint(&functionInfo);
  pJVar7 = JavascriptLibrary::CreateGeneratorFunction(this_00,entryPoint,scriptFunction);
LAB_00bce3d2:
  addr = &scriptFunction->realFunction;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pJVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pTVar2->noJsReentrancy = bVar1;
  return pJVar7;
}

Assistant:

JavascriptGeneratorFunction* JavascriptGeneratorFunction::OP_NewScGenFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        ScriptContext* scriptContext = functionProxy->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScGenFunc, reentrancylock, scriptContext->GetThreadContext());

        GeneratorVirtualScriptFunction* scriptFunction = scriptContext->GetLibrary()->CreateGeneratorVirtualScriptFunction(functionProxy);
        scriptFunction->SetEnvironment(environment);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(scriptFunction, EtwTrace::GetFunctionId(functionProxy)));

        JavascriptGeneratorFunction* genFunc = nullptr;
        if (functionProxy->IsAsync() && !functionProxy->IsModule())
        {
            if (functionProxy->IsGenerator())
            {
                genFunc = JavascriptAsyncGeneratorFunction::New(scriptContext, scriptFunction);
            }
            else
            {
                genFunc = JavascriptAsyncFunction::New(scriptContext, scriptFunction);
            }
        }
        else
        {
            genFunc = JavascriptGeneratorFunction::New(scriptContext, scriptFunction);
        }

        scriptFunction->SetRealGeneratorFunction(genFunc);

        return genFunc;
        JIT_HELPER_END(ScrFunc_OP_NewScGenFunc);
    }